

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::get_active_attrib(NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint32 dVar2;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *pMVar3;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  MessageBuilder local_408;
  GLchar local_288 [8];
  GLchar name [32];
  GLint local_260;
  GLenum type;
  GLint size;
  GLsizei length;
  GLint numActiveAttributes;
  string local_230;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  GLuint shader;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs._4_4_ =
       glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,puVar1,&local_1f9);
  getVtxFragVersionSources(&local_1d8,&local_1f8,ctx);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numActiveAttributes,puVar1,(allocator<char> *)((long)&length + 3));
  getVtxFragVersionSources(&local_230,(string *)&numActiveAttributes,ctx);
  glu::makeVtxFragSources(&local_1b8,&local_1d8,&local_230);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,renderCtx,&local_1b8);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&numActiveAttributes);
  std::allocator<char>::~allocator((allocator<char> *)((long)&length + 3));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  size = -1;
  type = 0xffffffff;
  local_260 = -1;
  name[0x1c] = -1;
  name[0x1d] = -1;
  name[0x1e] = -1;
  name[0x1f] = -1;
  ::deMemset(local_288,0,0x20);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,dVar2,0x8b89,&size);
  this = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_408,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_408,(char (*) [27])"// GL_ACTIVE_ATTRIBUTES = ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&size);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])" (expected 1).");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_408);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_429);
  NegativeTestContext::beginSection(ctx,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,0xffffffff,0,0x20,(GLsizei *)&type,&local_260,
             (GLenum *)(name + 0x1c),local_288);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_451);
  NegativeTestContext::beginSection(ctx,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_,0,0x20,
             (GLsizei *)&type,&local_260,(GLenum *)(name + 0x1c),local_288);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_ACTIVE_ATTRIBUTES."
             ,&local_479);
  NegativeTestContext::beginSection(ctx,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,dVar2,size,0x20,(GLsizei *)&type,&local_260,
             (GLenum *)(name + 0x1c),local_288);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"GL_INVALID_VALUE is generated if bufSize is less than 0.",
             &local_4a1);
  NegativeTestContext::beginSection(ctx,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  dVar2 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,dVar2,0,-1,(GLsizei *)&type,&local_260,
             (GLenum *)(name + 0x1c),local_288);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader
            (&ctx->super_CallLogWrapper,program.m_program.m_info.linkTimeUs._4_4_);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
  return;
}

Assistant:

void get_active_attrib (NegativeTestContext& ctx)
{
	GLuint				shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram	program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				numActiveAttributes	= -1;
	GLsizei				length				= -1;
	GLint				size				= -1;
	GLenum				type				= -1;
	GLchar				name[32];

	deMemset(&name[0], 0, sizeof(name));

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_ATTRIBUTES,	&numActiveAttributes);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_ATTRIBUTES = " << numActiveAttributes << " (expected 1)." << TestLog::EndMessage;

	ctx.glUseProgram(program.getProgram());

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveAttrib(-1, 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveAttrib(shader, 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_ACTIVE_ATTRIBUTES.");
	ctx.glGetActiveAttrib(program.getProgram(), numActiveAttributes, (int)sizeof(name), &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is less than 0.");
	ctx.glGetActiveAttrib(program.getProgram(), 0, -1, &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}